

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O0

bool pstore::operator==(sstring_view<const_char_*> *lhs,sstringview_maker *rhs)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  sstring_view<const_char_*> local_30;
  sstringview_maker *local_20;
  sstringview_maker *rhs_local;
  sstring_view<const_char_*> *lhs_local;
  
  local_20 = (sstringview_maker *)rhs;
  rhs_local = (sstringview_maker *)lhs;
  sVar2 = string_traits<pstore::sstring_view<const_char_*>_>::length(lhs);
  local_30 = (anonymous_namespace)::sstringview_maker::operator_cast_to_sstring_view(local_20);
  sVar3 = string_traits<(anonymous_namespace)::sstringview_maker>::length(&local_30);
  if (sVar2 == sVar3) {
    iVar1 = sstring_view<const_char_*>::compare<(anonymous_namespace)::sstringview_maker>
                      (&rhs_local->view_,(sstringview_maker *)local_20);
    lhs_local._7_1_ = iVar1 == 0;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

inline bool operator== (sstring_view<PointerType> const & lhs,
                            StringType const & rhs) noexcept {
        if (string_traits<sstring_view<PointerType>>::length (lhs) !=
            string_traits<StringType>::length (rhs)) {
            return false;
        }
        return lhs.compare (rhs) == 0;
    }